

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_tests.cpp
# Opt level: O2

void BasicTests::print_tree(string *savefolder,Graph *g)

{
  uint uVar1;
  Vertex *this;
  Edge *pEVar2;
  FILE *__stream;
  FILE *__stream_00;
  long lVar3;
  Edge **ppEVar4;
  double dVar5;
  string savename_e_aux;
  string savename_v_aux;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string *local_40;
  double local_38;
  
  std::operator+(&savename_v_aux,"mkdir ",savefolder);
  std::operator+(&savename_e_aux,&savename_v_aux," -p");
  system(savename_e_aux._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&savename_e_aux);
  std::__cxx11::string::~string((string *)&savename_v_aux);
  std::operator+(&savename_v_aux,"mkdir ",savefolder);
  std::operator+(&savename_e_aux,&savename_v_aux,"/Originals -p");
  system(savename_e_aux._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&savename_e_aux);
  std::__cxx11::string::~string((string *)&savename_v_aux);
  std::operator+(&savename_e_aux,savefolder,"/original_e_tree.csv");
  local_40 = savefolder;
  std::operator+(&savename_v_aux,savefolder,"/original_v_tree.csv");
  __stream = fopen(savename_e_aux._M_dataplus._M_p,"w");
  __stream_00 = fopen(savename_v_aux._M_dataplus._M_p,"w");
  while (this = g->verticesList, this != (Vertex *)0x0) {
    ppEVar4 = &this->edgesList;
    while (pEVar2 = *ppEVar4, pEVar2 != (Edge *)0x0) {
      if (pEVar2->closed == true) {
        fprintf(__stream,"%2d, %2d, %4.6f, %4.6f, %4.6f, %4.6f, %4.6f, %4.6f\n",pEVar2->activeLoss,
                pEVar2->activePowerFlow,pEVar2->reactiveLoss,pEVar2->reactivePowerFlow,
                pEVar2->resistance,pEVar2->reactance,(ulong)(uint)pEVar2->origin->id,
                (ulong)(uint)pEVar2->destiny->id);
      }
      ppEVar4 = &pEVar2->nextEdge;
    }
    uVar1 = this->id;
    std::vector<Capacitor,_std::allocator<Capacitor>_>::vector
              ((vector<Capacitor,_std::allocator<Capacitor>_> *)&local_60,&this->capacitorsAlloc);
    lVar3 = local_60._M_string_length - (long)local_60._M_dataplus._M_p;
    local_38 = Vertex::getActivePower(this);
    dVar5 = Vertex::getReactivePower(this);
    fprintf(__stream_00,"%2d, %1d, %4.6f, %4.6f, %4.6f\n",local_38,dVar5,this->voltage,(ulong)uVar1,
            lVar3 / 0x28 & 0xffffffff);
    std::vector<Capacitor,_std::allocator<Capacitor>_>::~vector
              ((vector<Capacitor,_std::allocator<Capacitor>_> *)&local_60);
    g = (Graph *)&this->nextVertex;
  }
  fclose(__stream_00);
  fclose(__stream);
  std::operator+(&local_60,"python3 printTree.py ",local_40);
  system(local_60._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&savename_v_aux);
  std::__cxx11::string::~string((string *)&savename_e_aux);
  return;
}

Assistant:

void BasicTests::print_tree(const string savefolder, Graph *g) {
    system(("mkdir " + savefolder + " -p").c_str());
    system(("mkdir " + savefolder + "/Originals -p").c_str());

    string savename_e_aux = savefolder + "/original_e_tree.csv";
    string savename_v_aux = savefolder + "/original_v_tree.csv";
    FILE *output_file_edges_aux = fopen((savename_e_aux).c_str(), "w");
    FILE *output_file_vertices_aux = fopen((savename_v_aux).c_str(), "w");

    for (Vertex *v_aux = g->get_verticesList(); v_aux != NULL; v_aux = v_aux->getNext()) {
        for (Edge *e = v_aux->getEdgesList(); e != NULL; e = e->getNext()) {
            if (e->isClosed())
                fprintf(output_file_edges_aux, "%2d, %2d, %4.6f, %4.6f, %4.6f, %4.6f, %4.6f, %4.6f\n",
                        e->getOrigin()->getID(), e->getDestiny()->getID(), e->getActiveLoss(), e->getActivePowerFlow(),
                        e->getReactiveLoss(), e->getReactivePowerFlow(), e->getResistance(), e->getReactance());
        }
        fprintf(output_file_vertices_aux, "%2d, %1d, %4.6f, %4.6f, %4.6f\n",
                v_aux->getID(), (int) v_aux->getCapacitors().size(), v_aux->getActivePower(), v_aux->getReactivePower(),
                v_aux->getVoltage());
    }
    fclose(output_file_vertices_aux);
    fclose(output_file_edges_aux);
    system(("python3 printTree.py " + savefolder).c_str()); // plota grafico da rede
}